

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_movi(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,tcg_target_long arg)

{
  TCGLabelPoolData *pTVar1;
  TCGLabelPoolData *pTVar2;
  byte *pbVar3;
  tcg_insn_unit *ptVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  tcg_target_long *ptVar8;
  long lVar9;
  TCGLabelPoolData *pTVar10;
  TCGLabelPoolData *pTVar11;
  ulong uVar12;
  TCGLabelPoolData *pTVar13;
  ulong uVar14;
  int in_R9D;
  byte bVar15;
  
  bVar15 = (byte)ret;
  if (2 < type - TCG_TYPE_V64) {
    if (TCG_TYPE_I64 < type) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x3ee,(char *)0x0);
    }
    if (ret < TCG_REG_XMM0) {
      if (arg != 0) {
        if (type == TCG_TYPE_I32 || (ulong)arg >> 0x20 == 0) {
          tcg_out_opc(s,ret | 0xb8,0,ret,0);
        }
        else {
          if ((int)arg != arg) {
            pbVar3 = s->code_ptr;
            lVar9 = (arg - (long)pbVar3) + -7;
            iVar7 = (int)lVar9;
            if (iVar7 == lVar9) {
              s->code_ptr = pbVar3 + 1;
              *pbVar3 = bVar15 >> 1 & 4 | 0x48;
              ptVar4 = s->code_ptr;
              s->code_ptr = ptVar4 + 1;
              *ptVar4 = 0x8d;
              pbVar3 = s->code_ptr;
              s->code_ptr = pbVar3 + 1;
              *pbVar3 = (bVar15 & 7) << 3 | 5;
              piVar5 = (int *)s->code_ptr;
              *piVar5 = iVar7;
              s->code_ptr = (tcg_insn_unit *)(piVar5 + 1);
              return;
            }
            tcg_out_opc(s,ret | 0x10b8,0,ret,0);
            ptVar8 = (tcg_target_long *)s->code_ptr;
            *ptVar8 = arg;
            ptVar8 = ptVar8 + 1;
            goto LAB_00d0ef31;
          }
          pbVar3 = s->code_ptr;
          s->code_ptr = pbVar3 + 1;
          *pbVar3 = (byte)(ret >> 3) | 0x48;
          ptVar4 = s->code_ptr;
          s->code_ptr = ptVar4 + 1;
          *ptVar4 = 199;
          pbVar3 = s->code_ptr;
          s->code_ptr = pbVar3 + 1;
          *pbVar3 = bVar15 & 7 | 0xc0;
        }
        piVar5 = (int *)s->code_ptr;
        *piVar5 = (int)arg;
        ptVar8 = (tcg_target_long *)(piVar5 + 1);
LAB_00d0ef31:
        s->code_ptr = (tcg_insn_unit *)ptVar8;
        return;
      }
      uVar6 = ret >> 3 | ret >> 1 & 4;
      if (uVar6 != 0) {
        pbVar3 = s->code_ptr;
        s->code_ptr = pbVar3 + 1;
        *pbVar3 = (byte)uVar6 | 0x40;
      }
      ptVar4 = s->code_ptr;
      s->code_ptr = ptVar4 + 1;
      *ptVar4 = '3';
      goto LAB_00d0ece5;
    }
  }
  uVar6 = (uint)(type == TCG_TYPE_V256) << 0x13;
  if (arg == -1) {
    uVar6 = uVar6 | 0x574;
  }
  else {
    if (arg != 0) {
      if (type == TCG_TYPE_V64) {
        ptVar4 = s->code_ptr;
        s->code_ptr = ptVar4 + 1;
        *ptVar4 = 0xc5;
        pbVar3 = s->code_ptr;
        s->code_ptr = pbVar3 + 1;
        *pbVar3 = (bVar15 & 8) << 4 ^ 0xfa;
        ptVar4 = s->code_ptr;
        s->code_ptr = ptVar4 + 1;
        *ptVar4 = '~';
      }
      else if (have_avx2_tricore) {
        tcg_out_vex_opc(s,uVar6 | 0x659,ret,0,0,in_R9D);
      }
      else {
        ptVar4 = s->code_ptr;
        s->code_ptr = ptVar4 + 1;
        *ptVar4 = 0xc5;
        pbVar3 = s->code_ptr;
        s->code_ptr = pbVar3 + 1;
        *pbVar3 = (bVar15 & 8) << 4 ^ 0xfb;
        ptVar4 = s->code_ptr;
        s->code_ptr = ptVar4 + 1;
        *ptVar4 = '\x12';
      }
      pbVar3 = s->code_ptr;
      s->code_ptr = pbVar3 + 1;
      *pbVar3 = (bVar15 & 7) << 3 | 5;
      ptVar4 = s->code_ptr;
      ptVar4[0] = '\0';
      ptVar4[1] = '\0';
      ptVar4[2] = '\0';
      ptVar4[3] = '\0';
      s->code_ptr = ptVar4 + 4;
      pTVar10 = (TCGLabelPoolData *)s->pool_cur;
      if (s->pool_end < &pTVar10[1].label) {
        pTVar10 = (TCGLabelPoolData *)tcg_malloc_internal_tricore(s,0x28);
      }
      else {
        s->pool_cur = (uint8_t *)&pTVar10[1].label;
      }
      pTVar10->label = ptVar4;
      pTVar10->addend = -4;
      pTVar10->rtype = 2;
      pTVar10->nlong = 1;
      pTVar10[1].next = (TCGLabelPoolData *)arg;
      pTVar1 = s->pool_labels;
      pTVar13 = (TCGLabelPoolData *)&s->pool_labels;
      while (pTVar11 = pTVar1, pTVar11 != (TCGLabelPoolData *)0x0) {
        if (pTVar11->nlong == 1) {
          pTVar1 = pTVar10[1].next;
          pTVar2 = pTVar11[1].next;
          uVar12 = (ulong)pTVar1 >> 0x38 | ((ulong)pTVar1 & 0xff000000000000) >> 0x28 |
                   ((ulong)pTVar1 & 0xff0000000000) >> 0x18 | ((ulong)pTVar1 & 0xff00000000) >> 8 |
                   ((ulong)pTVar1 & 0xff000000) << 8 | ((ulong)pTVar1 & 0xff0000) << 0x18 |
                   ((ulong)pTVar1 & 0xff00) << 0x28 | (long)pTVar1 << 0x38;
          uVar14 = (ulong)pTVar2 >> 0x38 | ((ulong)pTVar2 & 0xff000000000000) >> 0x28 |
                   ((ulong)pTVar2 & 0xff0000000000) >> 0x18 | ((ulong)pTVar2 & 0xff00000000) >> 8 |
                   ((ulong)pTVar2 & 0xff000000) << 8 | ((ulong)pTVar2 & 0xff0000) << 0x18 |
                   ((ulong)pTVar2 & 0xff00) << 0x28 | (long)pTVar2 << 0x38;
          if (-1 < (int)((uint)(uVar14 < uVar12) - (uint)(uVar12 < uVar14))) break;
        }
        else if (pTVar11->nlong == 0) break;
        pTVar13 = pTVar11;
        pTVar1 = pTVar11->next;
      }
      pTVar10->next = pTVar11;
      pTVar13->next = pTVar10;
      return;
    }
    uVar6 = 0x5ef;
  }
  tcg_out_vex_opc(s,uVar6,ret,ret,ret,in_R9D);
LAB_00d0ece5:
  pbVar3 = s->code_ptr;
  s->code_ptr = pbVar3 + 1;
  *pbVar3 = (bVar15 & 7) + bVar15 * '\b' | 0xc0;
  return;
}

Assistant:

static void tcg_out_movi(TCGContext *s, TCGType type,
                         TCGReg ret, tcg_target_long arg)
{
    tcg_target_long diff;

    switch (type) {
    case TCG_TYPE_I32:
#if TCG_TARGET_REG_BITS == 64
    case TCG_TYPE_I64:
#endif
        if (ret < 16) {
            break;
        }
        /* fallthru */
    case TCG_TYPE_V64:
    case TCG_TYPE_V128:
    case TCG_TYPE_V256:
        tcg_debug_assert(ret >= 16);
        tcg_out_dupi_vec(s, type, ret, arg);
        return;
    default:
        g_assert_not_reached();
    }

    if (arg == 0) {
        tgen_arithr(s, ARITH_XOR, ret, ret);
        return;
    }
    if (arg == (uint32_t)arg || type == TCG_TYPE_I32) {
        tcg_out_opc(s, OPC_MOVL_Iv + LOWREGMASK(ret), 0, ret, 0);
        tcg_out32(s, arg);
        return;
    }
    if (arg == (int32_t)arg) {
        tcg_out_modrm(s, OPC_MOVL_EvIz + P_REXW, 0, ret);
        tcg_out32(s, arg);
        return;
    }

    /* Try a 7 byte pc-relative lea before the 10 byte movq.  */
    diff = arg - ((uintptr_t)s->code_ptr + 7);
    if (diff == (int32_t)diff) {
        tcg_out_opc(s, OPC_LEA | P_REXW, ret, 0, 0);
        tcg_out8(s, (LOWREGMASK(ret) << 3) | 5);
        tcg_out32(s, diff);
        return;
    }

    tcg_out_opc(s, OPC_MOVL_Iv + P_REXW + LOWREGMASK(ret), 0, ret, 0);
    tcg_out64(s, arg);
}